

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,size_t maxSize)

{
  ulong local_28;
  size_t i;
  element_t value;
  size_t maxSize_local;
  vector<double> *this_local;
  
  this->max_size__ = maxSize;
  value = (element_t)maxSize;
  maxSize_local = (size_t)this;
  std::vector<double,_std::allocator<double>_>::vector(&this->container__);
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  i = 0;
  for (local_28 = 0; local_28 < this->max_size__; local_28 = local_28 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->container__,(value_type_conflict *)&i);
  }
  return;
}

Assistant:

vector(size_t maxSize) : max_size__(maxSize) {
          element_t value = 0;
          for(size_t i=0; i<max_size__; i++) container__.push_back(value);
      }